

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferTextureBufferRange::fillInputData
          (TextureBufferTextureBufferRange *this,GLubyte *buffer,GLuint offset,FormatInfo *info)

{
  GLubyte *pGVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  TestError *this_00;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int iVar53;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar54;
  int iVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  
  auVar15 = _DAT_01a9b030;
  auVar12 = _DAT_01a9b020;
  auVar4 = _DAT_01a25df0;
  auVar3 = _DAT_019fcc00;
  auVar2 = _DAT_019f5ce0;
  switch(info->m_input_type) {
  case 0x1400:
    if (info->m_n_components != 0) {
      lVar7 = 0;
      do {
        buffer[lVar7 + (ulong)offset] = '\x01';
        lVar7 = lVar7 + 1;
      } while ((uint)lVar7 < info->m_n_components);
    }
    break;
  case 0x1401:
    bVar5 = 0xff;
    if ((info->m_internal_format | 2) != 0x822b) {
      bVar5 = -(info->m_internal_format == 0x8058) | 1;
    }
    if (info->m_n_components != 0) {
      lVar7 = 0;
      do {
        buffer[lVar7 + (ulong)offset] = bVar5;
        lVar7 = lVar7 + 1;
      } while ((uint)lVar7 < info->m_n_components);
    }
    break;
  case 0x1402:
    uVar6 = (ulong)info->m_n_components;
    if (uVar6 != 0) {
      lVar7 = uVar6 - 1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar9 = auVar9 ^ _DAT_019f5ce0;
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      do {
        auVar18._8_4_ = (int)uVar8;
        auVar18._0_8_ = uVar8;
        auVar18._12_4_ = (int)(uVar8 >> 0x20);
        auVar10 = (auVar18 | auVar3) ^ auVar2;
        iVar39 = auVar9._0_4_;
        iVar54 = -(uint)(iVar39 < auVar10._0_4_);
        iVar13 = auVar9._4_4_;
        auVar24._4_4_ = -(uint)(iVar13 < auVar10._4_4_);
        iVar53 = auVar9._8_4_;
        iVar58 = -(uint)(iVar53 < auVar10._8_4_);
        iVar14 = auVar9._12_4_;
        auVar24._12_4_ = -(uint)(iVar14 < auVar10._12_4_);
        auVar40._4_4_ = iVar54;
        auVar40._0_4_ = iVar54;
        auVar40._8_4_ = iVar58;
        auVar40._12_4_ = iVar58;
        auVar60 = pshuflw(in_XMM11,auVar40,0xe8);
        auVar23._4_4_ = -(uint)(auVar10._4_4_ == iVar13);
        auVar23._12_4_ = -(uint)(auVar10._12_4_ == iVar14);
        auVar23._0_4_ = auVar23._4_4_;
        auVar23._8_4_ = auVar23._12_4_;
        auVar20 = pshuflw(in_XMM12,auVar23,0xe8);
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar10 = pshuflw(auVar60,auVar24,0xe8);
        auVar10 = (auVar10 | auVar20 & auVar60) ^ auVar16;
        auVar10 = packssdw(auVar10,auVar10);
        if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset)[1] = '\0';
        }
        auVar24 = auVar23 & auVar40 | auVar24;
        auVar10 = packssdw(auVar24,auVar24);
        auVar10 = packssdw(auVar10 ^ auVar16,auVar10 ^ auVar16);
        if ((auVar10._0_4_ >> 0x10 & 1) != 0) {
          (buffer + uVar8 * 2 + (ulong)offset + 2)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 2)[1] = '\0';
        }
        auVar10 = (auVar18 | auVar4) ^ auVar2;
        iVar54 = -(uint)(iVar39 < auVar10._0_4_);
        auVar55._4_4_ = -(uint)(iVar13 < auVar10._4_4_);
        iVar58 = -(uint)(iVar53 < auVar10._8_4_);
        auVar55._12_4_ = -(uint)(iVar14 < auVar10._12_4_);
        auVar25._4_4_ = iVar54;
        auVar25._0_4_ = iVar54;
        auVar25._8_4_ = iVar58;
        auVar25._12_4_ = iVar58;
        auVar41._4_4_ = -(uint)(auVar10._4_4_ == iVar13);
        auVar41._12_4_ = -(uint)(auVar10._12_4_ == iVar14);
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar10 = auVar41 & auVar25 | auVar55;
        auVar10 = packssdw(auVar10,auVar10);
        auVar10 = packssdw(auVar10 ^ auVar16,auVar10 ^ auVar16);
        if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 4)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 4)[1] = '\0';
        }
        auVar29 = pshufhw(auVar25,auVar25,0x84);
        auVar30 = pshufhw(auVar41,auVar41,0x84);
        auVar44 = pshufhw(auVar29,auVar55,0x84);
        auVar29 = (auVar44 | auVar30 & auVar29) ^ auVar16;
        auVar29 = packssdw(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 6)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 6)[1] = '\0';
        }
        auVar29 = (auVar18 | auVar15) ^ auVar2;
        iVar54 = -(uint)(iVar39 < auVar29._0_4_);
        auVar27._4_4_ = -(uint)(iVar13 < auVar29._4_4_);
        iVar58 = -(uint)(iVar53 < auVar29._8_4_);
        auVar27._12_4_ = -(uint)(iVar14 < auVar29._12_4_);
        auVar42._4_4_ = iVar54;
        auVar42._0_4_ = iVar54;
        auVar42._8_4_ = iVar58;
        auVar42._12_4_ = iVar58;
        auVar10 = pshuflw(auVar10,auVar42,0xe8);
        auVar26._4_4_ = -(uint)(auVar29._4_4_ == iVar13);
        auVar26._12_4_ = -(uint)(auVar29._12_4_ == iVar14);
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        auVar60 = pshuflw(auVar20 & auVar60,auVar26,0xe8);
        in_XMM12 = auVar60 & auVar10;
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        auVar10 = pshuflw(auVar10,auVar27,0xe8);
        auVar10 = (auVar10 | in_XMM12) ^ auVar16;
        in_XMM11 = packssdw(auVar10,auVar10);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 8)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 8)[1] = '\0';
        }
        auVar27 = auVar26 & auVar42 | auVar27;
        auVar10 = packssdw(auVar27,auVar27);
        auVar10 = packssdw(auVar10 ^ auVar16,auVar10 ^ auVar16);
        if ((auVar10 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 10)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 10)[1] = '\0';
        }
        auVar10 = (auVar18 | auVar12) ^ auVar2;
        iVar39 = -(uint)(iVar39 < auVar10._0_4_);
        auVar43._4_4_ = -(uint)(iVar13 < auVar10._4_4_);
        iVar53 = -(uint)(iVar53 < auVar10._8_4_);
        auVar43._12_4_ = -(uint)(iVar14 < auVar10._12_4_);
        auVar28._4_4_ = iVar39;
        auVar28._0_4_ = iVar39;
        auVar28._8_4_ = iVar53;
        auVar28._12_4_ = iVar53;
        auVar19._4_4_ = -(uint)(auVar10._4_4_ == iVar13);
        auVar19._12_4_ = -(uint)(auVar10._12_4_ == iVar14);
        auVar19._0_4_ = auVar19._4_4_;
        auVar19._8_4_ = auVar19._12_4_;
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar10 = auVar19 & auVar28 | auVar43;
        auVar10 = packssdw(auVar10,auVar10);
        auVar10 = packssdw(auVar10 ^ auVar16,auVar10 ^ auVar16);
        if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 0xc)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 0xc)[1] = '\0';
        }
        auVar60 = pshufhw(auVar28,auVar28,0x84);
        auVar10 = pshufhw(auVar19,auVar19,0x84);
        auVar20 = pshufhw(auVar60,auVar43,0x84);
        auVar10 = packssdw(auVar10 & auVar60,(auVar20 | auVar10 & auVar60) ^ auVar16);
        if ((auVar10 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 0xe)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 0xe)[1] = '\0';
        }
        uVar8 = uVar8 + 8;
      } while ((uVar6 + 7 & 0xfffffffffffffff8) != uVar8);
    }
    break;
  case 0x1403:
    uVar6 = (ulong)info->m_n_components;
    if (uVar6 != 0) {
      lVar7 = uVar6 - 1;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar11 = auVar11 ^ _DAT_019f5ce0;
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      do {
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar10 = (auVar21 | auVar3) ^ auVar2;
        iVar39 = auVar11._0_4_;
        iVar54 = -(uint)(iVar39 < auVar10._0_4_);
        iVar13 = auVar11._4_4_;
        auVar34._4_4_ = -(uint)(iVar13 < auVar10._4_4_);
        iVar53 = auVar11._8_4_;
        iVar58 = -(uint)(iVar53 < auVar10._8_4_);
        iVar14 = auVar11._12_4_;
        auVar34._12_4_ = -(uint)(iVar14 < auVar10._12_4_);
        auVar49._4_4_ = iVar54;
        auVar49._0_4_ = iVar54;
        auVar49._8_4_ = iVar58;
        auVar49._12_4_ = iVar58;
        auVar60 = pshuflw(in_XMM11,auVar49,0xe8);
        auVar33._4_4_ = -(uint)(auVar10._4_4_ == iVar13);
        auVar33._12_4_ = -(uint)(auVar10._12_4_ == iVar14);
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar20 = pshuflw(in_XMM12,auVar33,0xe8);
        auVar34._0_4_ = auVar34._4_4_;
        auVar34._8_4_ = auVar34._12_4_;
        auVar10 = pshuflw(auVar60,auVar34,0xe8);
        auVar10 = (auVar10 | auVar20 & auVar60) ^ auVar17;
        auVar10 = packssdw(auVar10,auVar10);
        if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset)[1] = '\0';
        }
        auVar34 = auVar33 & auVar49 | auVar34;
        auVar10 = packssdw(auVar34,auVar34);
        auVar10 = packssdw(auVar10 ^ auVar17,auVar10 ^ auVar17);
        if ((auVar10._0_4_ >> 0x10 & 1) != 0) {
          (buffer + uVar8 * 2 + (ulong)offset + 2)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 2)[1] = '\0';
        }
        auVar10 = (auVar21 | auVar4) ^ auVar2;
        iVar54 = -(uint)(iVar39 < auVar10._0_4_);
        auVar57._4_4_ = -(uint)(iVar13 < auVar10._4_4_);
        iVar58 = -(uint)(iVar53 < auVar10._8_4_);
        auVar57._12_4_ = -(uint)(iVar14 < auVar10._12_4_);
        auVar35._4_4_ = iVar54;
        auVar35._0_4_ = iVar54;
        auVar35._8_4_ = iVar58;
        auVar35._12_4_ = iVar58;
        auVar50._4_4_ = -(uint)(auVar10._4_4_ == iVar13);
        auVar50._12_4_ = -(uint)(auVar10._12_4_ == iVar14);
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar10 = auVar50 & auVar35 | auVar57;
        auVar10 = packssdw(auVar10,auVar10);
        auVar10 = packssdw(auVar10 ^ auVar17,auVar10 ^ auVar17);
        if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 4)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 4)[1] = '\0';
        }
        auVar29 = pshufhw(auVar35,auVar35,0x84);
        auVar30 = pshufhw(auVar50,auVar50,0x84);
        auVar44 = pshufhw(auVar29,auVar57,0x84);
        auVar29 = (auVar44 | auVar30 & auVar29) ^ auVar17;
        auVar29 = packssdw(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 6)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 6)[1] = '\0';
        }
        auVar29 = (auVar21 | auVar15) ^ auVar2;
        iVar54 = -(uint)(iVar39 < auVar29._0_4_);
        auVar37._4_4_ = -(uint)(iVar13 < auVar29._4_4_);
        iVar58 = -(uint)(iVar53 < auVar29._8_4_);
        auVar37._12_4_ = -(uint)(iVar14 < auVar29._12_4_);
        auVar51._4_4_ = iVar54;
        auVar51._0_4_ = iVar54;
        auVar51._8_4_ = iVar58;
        auVar51._12_4_ = iVar58;
        auVar10 = pshuflw(auVar10,auVar51,0xe8);
        auVar36._4_4_ = -(uint)(auVar29._4_4_ == iVar13);
        auVar36._12_4_ = -(uint)(auVar29._12_4_ == iVar14);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar60 = pshuflw(auVar20 & auVar60,auVar36,0xe8);
        in_XMM12 = auVar60 & auVar10;
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar10 = pshuflw(auVar10,auVar37,0xe8);
        auVar10 = (auVar10 | in_XMM12) ^ auVar17;
        in_XMM11 = packssdw(auVar10,auVar10);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 8)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 8)[1] = '\0';
        }
        auVar37 = auVar36 & auVar51 | auVar37;
        auVar10 = packssdw(auVar37,auVar37);
        auVar10 = packssdw(auVar10 ^ auVar17,auVar10 ^ auVar17);
        if ((auVar10 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 10)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 10)[1] = '\0';
        }
        auVar10 = (auVar21 | auVar12) ^ auVar2;
        iVar39 = -(uint)(iVar39 < auVar10._0_4_);
        auVar52._4_4_ = -(uint)(iVar13 < auVar10._4_4_);
        iVar53 = -(uint)(iVar53 < auVar10._8_4_);
        auVar52._12_4_ = -(uint)(iVar14 < auVar10._12_4_);
        auVar38._4_4_ = iVar39;
        auVar38._0_4_ = iVar39;
        auVar38._8_4_ = iVar53;
        auVar38._12_4_ = iVar53;
        auVar22._4_4_ = -(uint)(auVar10._4_4_ == iVar13);
        auVar22._12_4_ = -(uint)(auVar10._12_4_ == iVar14);
        auVar22._0_4_ = auVar22._4_4_;
        auVar22._8_4_ = auVar22._12_4_;
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar10 = auVar22 & auVar38 | auVar52;
        auVar10 = packssdw(auVar10,auVar10);
        auVar10 = packssdw(auVar10 ^ auVar17,auVar10 ^ auVar17);
        if ((auVar10 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 0xc)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 0xc)[1] = '\0';
        }
        auVar60 = pshufhw(auVar38,auVar38,0x84);
        auVar10 = pshufhw(auVar22,auVar22,0x84);
        auVar20 = pshufhw(auVar60,auVar52,0x84);
        auVar10 = packssdw(auVar10 & auVar60,(auVar20 | auVar10 & auVar60) ^ auVar17);
        if ((auVar10 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 0xe)[0] = '\x01';
          (buffer + uVar8 * 2 + (ulong)offset + 0xe)[1] = '\0';
        }
        uVar8 = uVar8 + 8;
      } while ((uVar6 + 7 & 0xfffffffffffffff8) != uVar8);
    }
    break;
  case 0x1404:
    if (info->m_n_components != 0) {
      lVar7 = 0;
      do {
        pGVar1 = buffer + lVar7 * 4 + (ulong)offset;
        pGVar1[0] = '\x01';
        pGVar1[1] = '\0';
        pGVar1[2] = '\0';
        pGVar1[3] = '\0';
        lVar7 = lVar7 + 1;
      } while ((uint)lVar7 < info->m_n_components);
    }
    break;
  case 0x1405:
    if (info->m_n_components != 0) {
      lVar7 = 0;
      do {
        pGVar1 = buffer + lVar7 * 4 + (ulong)offset;
        pGVar1[0] = '\x01';
        pGVar1[1] = '\0';
        pGVar1[2] = '\0';
        pGVar1[3] = '\0';
        lVar7 = lVar7 + 1;
      } while ((uint)lVar7 < info->m_n_components);
    }
    break;
  case 0x1406:
    uVar6 = (ulong)info->m_n_components;
    if (uVar6 != 0) {
      lVar7 = uVar6 - 1;
      auVar12._8_4_ = (int)lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar12 = auVar12 ^ _DAT_019f5ce0;
      do {
        auVar15._8_4_ = (int)uVar8;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar10 = (auVar15 | auVar3) ^ auVar2;
        iVar39 = auVar12._4_4_;
        if ((bool)(~(auVar10._4_4_ == iVar39 && auVar12._0_4_ < auVar10._0_4_ ||
                    iVar39 < auVar10._4_4_) & 1)) {
          pGVar1 = buffer + uVar8 * 4 + (ulong)offset;
          pGVar1[0] = '\0';
          pGVar1[1] = '\0';
          pGVar1[2] = 0x80;
          pGVar1[3] = '?';
        }
        if ((auVar10._12_4_ != auVar12._12_4_ || auVar10._8_4_ <= auVar12._8_4_) &&
            auVar10._12_4_ <= auVar12._12_4_) {
          pGVar1 = buffer + uVar8 * 4 + (ulong)offset + 4;
          pGVar1[0] = '\0';
          pGVar1[1] = '\0';
          pGVar1[2] = 0x80;
          pGVar1[3] = '?';
        }
        auVar15 = (auVar15 | auVar4) ^ auVar2;
        iVar13 = auVar15._4_4_;
        if (iVar13 <= iVar39 && (iVar13 != iVar39 || auVar15._0_4_ <= auVar12._0_4_)) {
          pGVar1 = buffer + uVar8 * 4 + (ulong)offset + 8;
          pGVar1[0] = '\0';
          pGVar1[1] = '\0';
          pGVar1[2] = 0x80;
          pGVar1[3] = '?';
          pGVar1 = buffer + uVar8 * 4 + (ulong)offset + 0xc;
          pGVar1[0] = '\0';
          pGVar1[1] = '\0';
          pGVar1[2] = 0x80;
          pGVar1[3] = '?';
        }
        uVar8 = uVar8 + 4;
      } while ((uVar6 + 3 & 0x1fffffffc) != uVar8);
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not allowed input type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
               ,0x56b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  case 0x140b:
    uVar6 = (ulong)info->m_n_components;
    if (uVar6 != 0) {
      lVar7 = uVar6 - 1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar10 = auVar10 ^ _DAT_019f5ce0;
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      do {
        auVar20._8_4_ = (int)uVar8;
        auVar20._0_8_ = uVar8;
        auVar20._12_4_ = (int)(uVar8 >> 0x20);
        auVar29 = (auVar20 | auVar3) ^ auVar2;
        iVar39 = auVar10._0_4_;
        iVar54 = -(uint)(iVar39 < auVar29._0_4_);
        iVar13 = auVar10._4_4_;
        auVar30._4_4_ = -(uint)(iVar13 < auVar29._4_4_);
        iVar53 = auVar10._8_4_;
        iVar58 = -(uint)(iVar53 < auVar29._8_4_);
        iVar14 = auVar10._12_4_;
        auVar30._12_4_ = -(uint)(iVar14 < auVar29._12_4_);
        auVar46._4_4_ = iVar54;
        auVar46._0_4_ = iVar54;
        auVar46._8_4_ = iVar58;
        auVar46._12_4_ = iVar58;
        auVar59 = pshuflw(in_XMM11,auVar46,0xe8);
        auVar44._4_4_ = -(uint)(auVar29._4_4_ == iVar13);
        auVar44._12_4_ = -(uint)(auVar29._12_4_ == iVar14);
        auVar44._0_4_ = auVar44._4_4_;
        auVar44._8_4_ = auVar44._12_4_;
        auVar61 = pshuflw(in_XMM12,auVar44,0xe8);
        auVar30._0_4_ = auVar30._4_4_;
        auVar30._8_4_ = auVar30._12_4_;
        auVar29 = pshuflw(auVar59,auVar30,0xe8);
        auVar29 = (auVar29 | auVar61 & auVar59) ^ auVar60;
        auVar29 = packssdw(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset)[1] = '<';
        }
        auVar30 = auVar44 & auVar46 | auVar30;
        auVar29 = packssdw(auVar30,auVar30);
        auVar29 = packssdw(auVar29 ^ auVar60,auVar29 ^ auVar60);
        if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
          (buffer + uVar8 * 2 + (ulong)offset + 2)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 2)[1] = '<';
        }
        auVar44 = (auVar20 | auVar4) ^ auVar2;
        iVar54 = -(uint)(iVar39 < auVar44._0_4_);
        auVar56._4_4_ = -(uint)(iVar13 < auVar44._4_4_);
        iVar58 = -(uint)(iVar53 < auVar44._8_4_);
        auVar56._12_4_ = -(uint)(iVar14 < auVar44._12_4_);
        auVar29._4_4_ = iVar54;
        auVar29._0_4_ = iVar54;
        auVar29._8_4_ = iVar58;
        auVar29._12_4_ = iVar58;
        auVar45._4_4_ = -(uint)(auVar44._4_4_ == iVar13);
        auVar45._12_4_ = -(uint)(auVar44._12_4_ == iVar14);
        auVar45._0_4_ = auVar45._4_4_;
        auVar45._8_4_ = auVar45._12_4_;
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar44 = auVar45 & auVar29 | auVar56;
        auVar44 = packssdw(auVar44,auVar44);
        auVar44 = packssdw(auVar44 ^ auVar60,auVar44 ^ auVar60);
        if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 4)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 4)[1] = '<';
        }
        auVar29 = pshufhw(auVar29,auVar29,0x84);
        auVar46 = pshufhw(auVar45,auVar45,0x84);
        auVar30 = pshufhw(auVar29,auVar56,0x84);
        auVar29 = (auVar30 | auVar46 & auVar29) ^ auVar60;
        auVar29 = packssdw(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 6)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 6)[1] = '<';
        }
        auVar29 = (auVar20 | auVar15) ^ auVar2;
        iVar54 = -(uint)(iVar39 < auVar29._0_4_);
        auVar32._4_4_ = -(uint)(iVar13 < auVar29._4_4_);
        iVar58 = -(uint)(iVar53 < auVar29._8_4_);
        auVar32._12_4_ = -(uint)(iVar14 < auVar29._12_4_);
        auVar47._4_4_ = iVar54;
        auVar47._0_4_ = iVar54;
        auVar47._8_4_ = iVar58;
        auVar47._12_4_ = iVar58;
        auVar44 = pshuflw(auVar44,auVar47,0xe8);
        auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar13);
        auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar14);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        auVar29 = pshuflw(auVar61 & auVar59,auVar31,0xe8);
        in_XMM12 = auVar29 & auVar44;
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar29 = pshuflw(auVar44,auVar32,0xe8);
        auVar29 = (auVar29 | in_XMM12) ^ auVar60;
        in_XMM11 = packssdw(auVar29,auVar29);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 8)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 8)[1] = '<';
        }
        auVar32 = auVar31 & auVar47 | auVar32;
        auVar29 = packssdw(auVar32,auVar32);
        auVar29 = packssdw(auVar29 ^ auVar60,auVar29 ^ auVar60);
        if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 10)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 10)[1] = '<';
        }
        auVar20 = (auVar20 | auVar12) ^ auVar2;
        iVar39 = -(uint)(iVar39 < auVar20._0_4_);
        auVar48._4_4_ = -(uint)(iVar13 < auVar20._4_4_);
        iVar53 = -(uint)(iVar53 < auVar20._8_4_);
        auVar48._12_4_ = -(uint)(iVar14 < auVar20._12_4_);
        auVar61._4_4_ = iVar39;
        auVar61._0_4_ = iVar39;
        auVar61._8_4_ = iVar53;
        auVar61._12_4_ = iVar53;
        auVar59._4_4_ = -(uint)(auVar20._4_4_ == iVar13);
        auVar59._12_4_ = -(uint)(auVar20._12_4_ == iVar14);
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar48._0_4_ = auVar48._4_4_;
        auVar48._8_4_ = auVar48._12_4_;
        auVar20 = auVar59 & auVar61 | auVar48;
        auVar20 = packssdw(auVar20,auVar20);
        auVar20 = packssdw(auVar20 ^ auVar60,auVar20 ^ auVar60);
        if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 0xc)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 0xc)[1] = '<';
        }
        auVar29 = pshufhw(auVar61,auVar61,0x84);
        auVar20 = pshufhw(auVar59,auVar59,0x84);
        auVar44 = pshufhw(auVar29,auVar48,0x84);
        auVar20 = packssdw(auVar20 & auVar29,(auVar44 | auVar20 & auVar29) ^ auVar60);
        if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (buffer + uVar8 * 2 + (ulong)offset + 0xe)[0] = '\0';
          (buffer + uVar8 * 2 + (ulong)offset + 0xe)[1] = '<';
        }
        uVar8 = uVar8 + 8;
      } while ((uVar6 + 7 & 0xfffffffffffffff8) != uVar8);
    }
  }
  return;
}

Assistant:

void TextureBufferTextureBufferRange::fillInputData(glw::GLubyte* buffer, glw::GLuint offset, FormatInfo& info)
{
	/* Initial value should give value equal to 1 on output */

	/* Check input data type */
	switch (info.get_input_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* pointer = reinterpret_cast<glw::GLfloat*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1.0f;
		}
	}
	break;

	case GL_HALF_FLOAT:
	{
		glw::GLhalf* pointer = reinterpret_cast<glw::GLhalf*>(&buffer[offset]);

		glw::GLfloat val = 1.0f;

		/* Convert float to half float */
		glw::GLuint	temp32   = 0;
		glw::GLuint	temp32_2 = 0;
		unsigned short temp16   = 0;
		unsigned short temp16_2 = 0;

		memcpy(&temp32, &val, sizeof(glw::GLfloat));
		temp32_2 = temp32 >> 31;
		temp16   = (unsigned short)((temp32_2 >> 31) << 5);
		temp32_2 = temp32 >> 23;
		temp16_2 = temp32_2 & 0xff;
		temp16_2 = (unsigned short)((temp16_2 - 0x70) & ((glw::GLuint)((glw::GLint)(0x70 - temp16_2) >> 4) >> 27));
		temp16   = (unsigned short)((temp16 | temp16_2) << 10);
		temp32_2 = temp32 >> 13;
		temp16   = (unsigned short)(temp16 | (temp32_2 & 0x3ff));

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = temp16;
		}
	}
	break;

	case GL_UNSIGNED_BYTE:
	{
		glw::GLubyte* pointer = reinterpret_cast<glw::GLubyte*>(&buffer[offset]);
		glw::GLubyte  val	 = 0;

		/* Normalized Values */
		if (info.get_internal_format() == GL_R8 || info.get_internal_format() == GL_RG8 ||
			info.get_internal_format() == GL_RGBA8)
		{
			val = 255;
		}
		else
		{
			val = 1;
		}
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = val;
		}
	}
	break;

	case GL_UNSIGNED_SHORT:
	{
		glw::GLushort* pointer = reinterpret_cast<glw::GLushort*>(&buffer[offset]);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLushort)1;
		}
	}
	break;
	case GL_UNSIGNED_INT:
	{
		glw::GLuint* pointer = reinterpret_cast<glw::GLuint*>(&buffer[offset]);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1;
		}
	}
	break;
	case GL_INT:
	{
		glw::GLint* pointer = reinterpret_cast<glw::GLint*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1;
		}
	}
	break;
	case GL_SHORT:
	{
		glw::GLshort* pointer = reinterpret_cast<glw::GLshort*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLshort)1;
		}
	}
	break;
	case GL_BYTE:
	{
		glw::GLbyte* pointer = reinterpret_cast<glw::GLbyte*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLbyte)1;
		}
	}
	break;
	default:
		TCU_FAIL("Not allowed input type");
	}
}